

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O1

bool __thiscall ON_BrepLoopArray::Write(ON_BrepLoopArray *this,ON_BinaryArchive *file)

{
  uint i;
  ON_BrepLoop *pOVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  
  bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
  if (bVar2) {
    bVar3 = ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
    i = (this->super_ON_ObjectArray<ON_BrepLoop>).super_ON_ClassArray<ON_BrepLoop>.m_count;
    if ((bool)bVar3) {
      bVar3 = ON_BinaryArchive::WriteInt(file,i);
    }
    if ((0 < (int)i & bVar3) == 1) {
      lVar5 = 0;
      uVar4 = 1;
      do {
        pOVar1 = (this->super_ON_ObjectArray<ON_BrepLoop>).super_ON_ClassArray<ON_BrepLoop>.m_a;
        bVar3 = (**(code **)(*(long *)((long)&(pOVar1->super_ON_Geometry).super_ON_Object.
                                              _vptr_ON_Object + lVar5) + 0x50))
                          ((long)&(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object +
                           lVar5,file);
        if (bVar3 == 0) break;
        lVar5 = lVar5 + 0x78;
        bVar2 = uVar4 < i;
        uVar4 = uVar4 + 1;
      } while (bVar2);
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar2 = (bool)(bVar2 & bVar3);
  }
  return bVar2;
}

Assistant:

bool ON_BrepLoopArray::Write( ON_BinaryArchive& file ) const
{
  int i;
  bool rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
  if (rc) {
    rc = file.Write3dmChunkVersion(1,0);
    const int count = Count();
    if (rc) rc = file.WriteInt( count );
    for ( i = 0; rc && i < count; i++ ) {
      if (rc) rc = m_a[i].Write(file);
    }
    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}